

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O3

BindingAlias * __thiscall
duckdb::Binder::RetrieveUsingBinding
          (BindingAlias *__return_storage_ptr__,Binder *this,Binder *current_binder,
          optional_ptr<duckdb::UsingColumnSet,_true> current_set,string *using_column,
          string *join_side)

{
  optional_ptr<duckdb::UsingColumnSet,_true> local_90;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_90.ptr = current_set.ptr;
  BindingAlias::BindingAlias(__return_storage_ptr__);
  if (current_set.ptr == (UsingColumnSet *)0x0) {
    FindBinding((BindingAlias *)local_88,current_binder,using_column,join_side);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->schema,(string *)&local_68)
    ;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->alias,(string *)&local_48);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
    if (local_68._M_p != local_58) {
      operator_delete(local_68._M_p);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  else {
    optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid(&local_90);
    ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->schema);
    ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->alias);
  }
  return __return_storage_ptr__;
}

Assistant:

BindingAlias Binder::RetrieveUsingBinding(Binder &current_binder, optional_ptr<UsingColumnSet> current_set,
                                          const string &using_column, const string &join_side) {
	BindingAlias binding;
	if (!current_set) {
		binding = current_binder.FindBinding(using_column, join_side);
	} else {
		binding = current_set->primary_binding;
	}
	return binding;
}